

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O3

exr_result_t update_chunk_offsets(exr_context_t ctxt,_internal_exr_seq_scratch *scratch)

{
  uint uVar1;
  exr_priv_part_t curpart;
  exr_result_t eVar2;
  uint uVar3;
  undefined8 in_RAX;
  long in_RDX;
  char *pcVar4;
  exr_priv_part_t p_Var5;
  ulong uVar6;
  
  if (ctxt->parts == (exr_priv_part_t *)0x0) {
    eVar2 = 3;
  }
  else {
    p_Var5 = *ctxt->parts;
    p_Var5->chunk_table_offset = in_RDX - (long)scratch;
    if (0 < ctxt->num_parts) {
      uVar6 = 0;
      do {
        curpart = ctxt->parts[uVar6];
        eVar2 = internal_exr_compute_tile_information(ctxt,curpart,0);
        if (eVar2 != 0) {
          return eVar2;
        }
        uVar3 = internal_exr_compute_chunk_offset_size(curpart);
        if ((int)uVar3 < 0) {
          if (curpart->name == (exr_attribute_t *)0x0) {
            pcVar4 = "<first>";
          }
          else {
            pcVar4 = (char *)((curpart->name->field_6).chlist)->entries;
          }
          eVar2 = (*ctxt->print_error)
                            (ctxt,0xe,"Invalid chunk count (%d) for part \'%s\'",(ulong)uVar3,pcVar4
                             ,ctxt->print_error);
          return eVar2;
        }
        uVar1 = curpart->chunk_count;
        if ((int)uVar1 < 0) {
LAB_001276cb:
          curpart->chunk_count = uVar3;
        }
        else if (uVar1 != uVar3) {
          pcVar4 = "<first>";
          if (curpart->name != (exr_attribute_t *)0x0) {
            pcVar4 = (char *)((curpart->name->field_6).chlist)->entries;
          }
          in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),uVar3);
          (*ctxt->print_error)
                    (ctxt,0xe,"Invalid chunk count (%d) for part \'%s\' (%d), expect (%d)",
                     (ulong)uVar1,pcVar4,uVar6 & 0xffffffff,in_RAX);
          goto LAB_001276cb;
        }
        if (p_Var5 != curpart) {
          curpart->chunk_table_offset = (long)p_Var5->chunk_count * 8 + p_Var5->chunk_table_offset;
        }
        uVar6 = uVar6 + 1;
        p_Var5 = curpart;
      } while ((long)uVar6 < (long)ctxt->num_parts);
    }
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

static exr_result_t
update_chunk_offsets (
    exr_context_t ctxt, struct _internal_exr_seq_scratch* scratch)
{
    exr_priv_part_t curpart, prevpart;

    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!ctxt->parts) return EXR_ERR_INVALID_ARGUMENT;

    ctxt->parts[0]->chunk_table_offset =
        scratch->fileoff - (uint64_t) scratch->navail;
    prevpart = ctxt->parts[0];

    for (int p = 0; p < ctxt->num_parts; ++p)
    {
        int32_t ccount;

        curpart = ctxt->parts[p];

        rv = internal_exr_compute_tile_information (ctxt, curpart, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curpart);
        if (ccount < 0)
        {
            rv = ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunk count (%d) for part '%s'",
                ccount,
                (curpart->name ? curpart->name->string->str : "<first>"));
            break;
        }

        if (curpart->chunk_count < 0)
            curpart->chunk_count = ccount;
        else if (curpart->chunk_count != ccount)
        {
            /* fatal error or just ignore it? c++ seemed to just ignore it entirely, we can at least warn */
            /* rv = */
            ctxt->print_error (
                ctxt,
                EXR_ERR_INVALID_ATTR,
                "Invalid chunk count (%d) for part '%s' (%d), expect (%d)",
                curpart->chunk_count,
                (curpart->name ? curpart->name->string->str : "<first>"),
                p,
                ccount);
            curpart->chunk_count = ccount;
        }
        if (prevpart != curpart)
            curpart->chunk_table_offset =
                prevpart->chunk_table_offset +
                sizeof (uint64_t) * (size_t) (prevpart->chunk_count);
        prevpart = curpart;
    }
    return rv;
}